

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merger.cc
# Opt level: O0

void __thiscall leveldb::anon_unknown_0::MergingIterator::SeekToFirst(MergingIterator *this)

{
  int local_14;
  int i;
  MergingIterator *this_local;
  
  for (local_14 = 0; local_14 < this->n_; local_14 = local_14 + 1) {
    IteratorWrapper::SeekToFirst(this->children_ + local_14);
  }
  FindSmallest(this);
  this->direction_ = kForward;
  return;
}

Assistant:

void SeekToFirst() override {
    for (int i = 0; i < n_; i++) {
      children_[i].SeekToFirst();
    }
    FindSmallest();
    direction_ = kForward;
  }